

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

void __thiscall Lowerer::LoadStackArgPtr(Lowerer *this,Instr *instr)

{
  StackSym *stackSym;
  Func *func;
  code *pcVar1;
  bool bVar2;
  byte bVar3;
  undefined4 *puVar4;
  SymOpnd *pSVar5;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2132,"(instr)","instr");
    if (!bVar2) goto LAB_0059fd29;
    *puVar4 = 0;
  }
  if (instr->m_dst == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2133,"(instr->GetDst())","instr->GetDst()");
    if (!bVar2) goto LAB_0059fd29;
    *puVar4 = 0;
  }
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2134,"(!instr->GetSrc1())","!instr->GetSrc1()");
    if (!bVar2) goto LAB_0059fd29;
    *puVar4 = 0;
  }
  if (instr->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2135,"(!instr->GetSrc2())","!instr->GetSrc2()");
    if (!bVar2) goto LAB_0059fd29;
    *puVar4 = 0;
  }
  bVar2 = Func::IsInlinee(instr->m_func);
  if (!bVar2) {
    LowererMD::LoadStackArgPtr(&this->m_lowererMD,instr);
    return;
  }
  pSVar5 = Func::GetInlineeArgvSlotOpnd(instr->m_func);
  stackSym = (StackSym *)pSVar5->m_sym;
  if ((stackSym->super_Sym).m_kind != SymKindStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
    if (!bVar2) goto LAB_0059fd29;
    *puVar4 = 0;
  }
  Func::SetArgOffset(this->m_func,stackSym,stackSym->m_offset + 8);
  pSVar5 = IR::SymOpnd::New((Sym *)stackSym,TyUint64,instr->m_func);
  if (instr->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar2) goto LAB_0059fd29;
    *puVar4 = 0;
  }
  func = instr->m_func;
  if ((pSVar5->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar2) {
LAB_0059fd29:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  bVar3 = (pSVar5->super_Opnd).field_0xb;
  if ((bVar3 & 2) != 0) {
    pSVar5 = (SymOpnd *)IR::Opnd::Copy(&pSVar5->super_Opnd,func);
    bVar3 = (pSVar5->super_Opnd).field_0xb;
  }
  (pSVar5->super_Opnd).field_0xb = bVar3 | 2;
  instr->m_src1 = &pSVar5->super_Opnd;
  ChangeToLea(instr);
  return;
}

Assistant:

void
Lowerer::LoadStackArgPtr(IR::Instr *const instr)
{
    Assert(instr);
    Assert(instr->GetDst());
    Assert(!instr->GetSrc1());
    Assert(!instr->GetSrc2());

    if(instr->m_func->IsInlinee())
    {
        // Address of argument after 'this'
        const auto firstRealArgStackSym = instr->m_func->GetInlineeArgvSlotOpnd()->m_sym->AsStackSym();
        this->m_func->SetArgOffset(firstRealArgStackSym, firstRealArgStackSym->m_offset + MachPtr);
        instr->SetSrc1(IR::SymOpnd::New(firstRealArgStackSym, TyMachPtr, instr->m_func));
        ChangeToLea(instr);
    }
    else
    {
        m_lowererMD.LoadStackArgPtr(instr);
    }
}